

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O3

void __thiscall Shell::parse(Shell *this,Element *s)

{
  char *extraout_RDX;
  Literals local_50;
  
  wasm::Element::operator[]((uint)s);
  wasm::Element::str();
  if (extraout_RDX == _getMemBytes) {
    parseModule(this,s);
    return;
  }
  if (extraout_RDX == REGISTER.super_IString.str._M_str) {
    parseRegister(this,s);
    return;
  }
  if (extraout_RDX == INVOKE.super_IString.str._M_str) {
    parseOperation(&local_50,this,s);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              (&local_50.super_SmallVector<wasm::Literal,_1UL>.flexible);
    wasm::Literal::~Literal(local_50.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
  }
  else {
    if (extraout_RDX == ASSERT_RETURN.super_IString.str._M_str) {
      parseAssertReturn(this,s);
      return;
    }
    if (extraout_RDX == ASSERT_TRAP.super_IString.str._M_str) {
      parseAssertTrap(this,s);
      return;
    }
    if ((extraout_RDX == ASSERT_INVALID.super_IString.str._M_str) ||
       (extraout_RDX == ASSERT_MALFORMED.super_IString.str._M_str)) {
      parseModuleAssertion(this,s);
      return;
    }
  }
  return;
}

Assistant:

void parse(Element& s) {
    IString id = s[0]->str();
    if (id == MODULE) {
      parseModule(s);
    } else if (id == REGISTER) {
      parseRegister(s);
    } else if (id == INVOKE) {
      parseOperation(s);
    } else if (id == ASSERT_RETURN) {
      parseAssertReturn(s);
    } else if (id == ASSERT_TRAP) {
      parseAssertTrap(s);
    } else if ((id == ASSERT_INVALID) || (id == ASSERT_MALFORMED)) {
      parseModuleAssertion(s);
    }
  }